

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O0

void OpenMD::Utils::details::lifted_deleter<OpenMD::CutoffGroup*>(CutoffGroup *val)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    CutoffGroup::~CutoffGroup((CutoffGroup *)0x23e943);
    operator_delete(in_RDI,0x40);
  }
  return;
}

Assistant:

void lifted_deleter(T val) {
      delete val;
    }